

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alffplay.cpp
# Opt level: O1

int __thiscall
anon_unknown.dwarf_e23c::PacketQueue<2097152UL>::sendTo
          (PacketQueue<2097152UL> *this,AVCodecContext *codecctx)

{
  int iVar1;
  long *plVar2;
  _Elt_pointer pAVar3;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_38;
  
  local_38._M_owns = false;
  local_38._M_device = &this->mMutex;
  std::unique_lock<std::mutex>::lock(&local_38);
  local_38._M_owns = true;
  pAVar3 = (this->mPackets).super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  if ((this->mPackets).super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur == pAVar3) {
    do {
      if (this->mFinished != false) {
        pAVar3 = (_Elt_pointer)0x0;
        break;
      }
      std::condition_variable::wait((unique_lock *)&this->mCondVar);
      pAVar3 = (this->mPackets).super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur;
    } while ((this->mPackets).super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur == pAVar3);
  }
  if (pAVar3 == (_Elt_pointer)0x0) {
    iVar1 = avcodec_send_packet(codecctx,0);
  }
  else {
    iVar1 = avcodec_send_packet(codecctx);
    if (iVar1 != -0xb) {
      if (iVar1 < 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Failed to send packet: ",0x17);
        plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
        std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
        std::ostream::put((char)plVar2);
        std::ostream::flush();
      }
      this->mTotalSize =
           this->mTotalSize -
           (ulong)(uint)((this->mPackets).super__Deque_base<AVPacket,_std::allocator<AVPacket>_>.
                         _M_impl.super__Deque_impl_data._M_start._M_cur)->size;
      av_packet_unref();
      std::deque<AVPacket,_std::allocator<AVPacket>_>::pop_front(&this->mPackets);
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_38);
  return iVar1;
}

Assistant:

int sendTo(AVCodecContext *codecctx)
    {
        std::unique_lock<std::mutex> lock{mMutex};

        AVPacket *pkt{getPacket(lock)};
        if(!pkt) return avcodec_send_packet(codecctx, nullptr);

        const int ret{avcodec_send_packet(codecctx, pkt)};
        if(ret != AVERROR(EAGAIN))
        {
            if(ret < 0)
                std::cerr<< "Failed to send packet: "<<ret <<std::endl;
            pop();
        }
        return ret;
    }